

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LispPrint.cpp
# Opt level: O1

void __thiscall SymbolTable::SymbolTable(SymbolTable *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  Form *__tmp;
  
  (this->map)._M_h._M_buckets = &(this->map)._M_h._M_single_bucket;
  (this->map)._M_h._M_bucket_count = 1;
  (this->map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->map)._M_h._M_element_count = 0;
  (this->map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->empty_pair).super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->empty_pair).super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0015b690;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[1]._M_use_count = 0;
  p_Var1[1]._M_weak_count = 0;
  p_Var1[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[2]._M_use_count = 0;
  p_Var1[2]._M_weak_count = 0;
  p_Var1[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var1[3]._M_use_count = 0;
  p_Var1[3]._M_weak_count = 0;
  (this->empty_pair).super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var1 + 1);
  this_00 = (this->empty_pair).super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (this->empty_pair).super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1
  ;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  ((this->empty_pair).super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->kind =
       EMPTY_LIST;
  return;
}

Assistant:

SymbolTable::SymbolTable() {
  empty_pair = std::make_shared<Form>();
  empty_pair->kind = FormKind::EMPTY_LIST;
}